

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_long,unsigned_char>(void)

{
  bool bVar1;
  uint in_stack_ffffffffffffffa8;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffac;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc0;
  
  rhs.m_int = (uchar)((uint)in_stack_ffffffffffffffbc >> 0x18);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffffb0.m_int,
               (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = ::operator!=((uchar)((uint)in_stack_ffffffffffffffac >> 0x18),in_stack_ffffffffffffffb0);
  uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)in_stack_ffffffffffffffb0.m_int,
                 (int *)(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8) &
                        0xffffffff00ffffff));
    bVar1 = ::operator!=(in_stack_ffffffffffffffb0,(uchar)((uint)in_stack_ffffffffffffffac >> 0x18))
    ;
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)in_stack_ffffffffffffffb0.m_int,
                     (int *)(CONCAT44(in_stack_ffffffffffffffac,uVar2) & 0xffffffff00ffffff));
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)in_stack_ffffffffffffffb0.m_int,
                     (int *)CONCAT44(in_stack_ffffffffffffffac,uVar3));
      bVar1 = ::operator!=(in_stack_ffffffffffffffc0,rhs);
      uVar2 = uVar3 & 0xffffff;
      uVar4 = uVar2;
      if (bVar1) {
        SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
        ::SafeInt<int>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)in_stack_ffffffffffffffb0.m_int,
                       (int *)(CONCAT44(in_stack_ffffffffffffffac,uVar3) & 0xffffffff00ffffff));
        bVar1 = ::operator!=(SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0),
                             in_stack_ffffffffffffffb0);
        uVar4 = uVar2 & 0xffffff;
        if (bVar1) {
          bVar1 = false;
          SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::SafeInt<int>((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)in_stack_ffffffffffffffb0.m_int,(int *)(ulong)(uVar2 & 0xffffff));
          bVar1 = ::operator!=(bVar1,in_stack_ffffffffffffffb0);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}